

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Remove(BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this,FunctionBody **key)

{
  bool bVar1;
  uint local_2c;
  int local_28;
  uint targetBucket;
  int last;
  int i;
  FunctionBody **key_local;
  BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  _last = key;
  key_local = (FunctionBody **)this;
  bVar1 = BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<Js::FunctionBody*>
                    ((BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this,key,(int *)&targetBucket,&local_28,&local_2c);
  if (bVar1) {
    RemoveAt(this,targetBucket,local_28,local_2c);
  }
  return bVar1;
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }